

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.h
# Opt level: O1

Analysis __thiscall spvtools::opt::InterpFixupPass::GetPreservedAnalyses(InterpFixupPass *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisIdToFuncMapping|kAnalysisBuiltinVarId|
         kAnalysisStructuredCFG|kAnalysisValueNumberTable|kAnalysisRegisterPressure|
         kAnalysisScalarEvolution|kAnalysisNameMap|kAnalysisLoopAnalysis|kAnalysisDominatorAnalysis|
         kAnalysisCFG|kAnalysisCombinators|kAnalysisDecorations|kAnalysisInstrToBlockMapping|
         kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisScalarEvolution |
           IRContext::kAnalysisRegisterPressure |
           IRContext::kAnalysisValueNumberTable |
           IRContext::kAnalysisStructuredCFG |
           IRContext::kAnalysisBuiltinVarId |
           IRContext::kAnalysisIdToFuncMapping | IRContext::kAnalysisTypes |
           IRContext::kAnalysisDefUse | IRContext::kAnalysisConstants;
  }